

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BotSharedData.cpp
# Opt level: O0

void __thiscall tiger::trains::ai::BotSharedData::BotSharedData(BotSharedData *this)

{
  long in_RDI;
  HomeChecker *this_00;
  
  std::
  set<const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
  ::set((set<const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
         *)0x255e18);
  std::
  set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  ::set((set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
         *)0x255e2a);
  this_00 = (HomeChecker *)(in_RDI + 0x60);
  std::
  map<const_tiger::trains::world::Point_*,_tiger::trains::ai::Barrier,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_tiger::trains::ai::Barrier>_>_>
  ::map((map<const_tiger::trains::world::Point_*,_tiger::trains::ai::Barrier,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_tiger::trains::ai::Barrier>_>_>
         *)0x255e3d);
  std::
  map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
  ::map((map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
         *)0x255e53);
  HomeChecker::HomeChecker(this_00);
  return;
}

Assistant:

BotSharedData::BotSharedData()
{

}